

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

int tinyusdz::USDZReadAsset
              (char *resolved_asset_name,uint64_t req_bytes,uint8_t *out_buf,uint64_t *nbytes,
              string *err,void *userdata)

{
  _Base_ptr p_Var1;
  size_t sVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  long *plVar5;
  _Base_ptr p_Var6;
  size_type *psVar7;
  int iVar8;
  ulong __n;
  key_type local_98;
  _Base_ptr local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (userdata == (void *)0x0) {
    iVar8 = -1;
joined_r0x0012e861:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    return iVar8;
  }
  if (resolved_asset_name == (char *)0x0) {
    iVar8 = -2;
    goto joined_r0x0012e861;
  }
  if ((out_buf == (uint8_t *)0x0) || (nbytes == (uint64_t *)0x0)) {
    iVar8 = -2;
    goto joined_r0x0012e861;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  sVar2 = strlen(resolved_asset_name);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,resolved_asset_name,resolved_asset_name + sVar2);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                  *)userdata,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    local_78 = cVar3._M_node;
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    cVar3._M_node = local_78;
  }
  if (cVar3._M_node == (_Base_ptr)((long)userdata + 8)) {
    iVar8 = -1;
    if (err == (string *)0x0) {
      return -1;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    sVar2 = strlen(resolved_asset_name);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,resolved_asset_name,resolved_asset_name + sVar2);
    plVar5 = (long *)::std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3f2bce);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50.field_2._8_8_ = plVar5[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar7;
      local_50._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_50._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98.field_2._8_8_ = plVar5[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_98._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012eaad;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar2 = strlen(resolved_asset_name);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,resolved_asset_name,resolved_asset_name + sVar2);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)userdata,&local_98);
    p_Var1 = (_Base_ptr)pmVar4->second;
    p_Var6 = (_Base_ptr)pmVar4->first;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      local_78 = (_Base_ptr)pmVar4->first;
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      p_Var6 = local_78;
    }
    __n = (long)p_Var1 - (long)p_Var6;
    if (p_Var1 < p_Var6 || __n == 0) {
      iVar8 = -2;
      goto joined_r0x0012e861;
    }
    if (req_bytes < __n) {
      if (err == (string *)0x0) {
        return -2;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar2 = strlen(resolved_asset_name);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,resolved_asset_name,resolved_asset_name + sVar2);
      ::std::operator+(&local_50,"USDZAsset ",&local_70);
    }
    else {
      if (p_Var1 <= (_Base_ptr)(*(long *)((long)userdata + 0x38) - *(long *)((long)userdata + 0x30))
         ) {
        memcpy(out_buf,(void *)((long)&p_Var6->_M_color + *(long *)((long)userdata + 0x30)),__n);
        *nbytes = __n;
        return 0;
      }
      if (err == (string *)0x0) {
        return -2;
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      sVar2 = strlen(resolved_asset_name);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,resolved_asset_name,resolved_asset_name + sVar2);
      ::std::operator+(&local_50,"Invalid USDZAsset size: ",&local_70);
    }
    iVar8 = -2;
    plVar5 = (long *)::std::__cxx11::string::append((char *)&local_50);
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98.field_2._8_8_ = plVar5[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar7;
      local_98._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_98._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    ::std::__cxx11::string::_M_append((char *)err,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012eaad;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0012eaad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return iVar8;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return iVar8;
}

Assistant:

int USDZReadAsset(const char *resolved_asset_name, uint64_t req_bytes, uint8_t *out_buf, uint64_t *nbytes, std::string *err, void *userdata) {
  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -1;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!out_buf) {
    if (err) {
      (*err) += "`out_buf` must be non-null.\n";
    }
    return -2;
  }

  if (!nbytes) {
    if (err) {
      (*err) += "`nbytes` must be non-null.\n";
    }
    return -2;
  }

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (!passet->asset_map.count(resolved_asset_name)) {
    if (err) {
      (*err) += "resolved_asset_name `" + std::string(resolved_asset_name) + "` not found in USDZAsset.\n";
    }
    return -1;
  }

  std::pair<size_t, size_t> byte_range = passet->asset_map.at(resolved_asset_name);

  if (byte_range.first >= byte_range.second) {
    if (err) {
      (*err) += "Invalid USDZAsset byte range.\n";
    }
    return -2;
  }

  size_t sz = byte_range.second - byte_range.first;

  if (sz > req_bytes) {
    if (err) {
      (*err) += "USDZAsset " + std::string(resolved_asset_name) + "'s size exceeds requested bytes.\n";
    }
    return -2;
  }

  if (byte_range.first + sz > passet->data.size()) {
    if (err) {
      (*err) += "Invalid USDZAsset size: " + std::string(resolved_asset_name) + "\n";
    }
    return -2;
  }

  memcpy(out_buf, passet->data.data() + byte_range.first, sz);
  (*nbytes) = sz;

  return 0;
}